

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>>
          (ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
           *this,ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> begin,
          ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> end,char *sep,
          int precedence)

{
  BasicWriter<char> *this_00;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> e;
  size_t sVar1;
  BasicStringRef<char> value;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_38;
  
  local_38.ptr_ = begin.ptr_;
  fmt::BasicWriter<char>::operator<<(*(BasicWriter<char> **)(this + 8),'(');
  if (begin.ptr_ != end.ptr_) {
    while( true ) {
      e = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::operator*
                    (&local_38);
      ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
      ::Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
               *)this,(LogicalExpr)e.super_ExprBase.impl_,precedence);
      local_38.ptr_ = local_38.ptr_ + 1;
      if (local_38.ptr_ == end.ptr_) break;
      this_00 = *(BasicWriter<char> **)(this + 8);
      sVar1 = strlen(sep);
      value.size_ = sVar1;
      value.data_ = sep;
      fmt::BasicWriter<char>::operator<<(this_00,value);
    }
  }
  fmt::BasicWriter<char>::operator<<(*(BasicWriter<char> **)(this + 8),')');
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteArgs(
    Iter begin, Iter end, const char *sep, int precedence) {
  writer_ << '(';
  if (begin != end) {
    Visit(*begin, precedence);
    for (++begin; begin != end; ++begin) {
      writer_ << sep;
      Visit(*begin, precedence);
    }
  }
  writer_ << ')';
}